

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O1

int iterPolyReset(mpt_iterator *it)

{
  it[5]._vptr = (_mpt_vptr_iterator *)0x0;
  if (it[4]._vptr != (_mpt_vptr_iterator *)0x0) {
    return (int)((ulong)it[4]._vptr[1].value >> 3);
  }
  return 0;
}

Assistant:

static int iterPolyReset(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorPolynom) *d = MPT_baseaddr(iteratorPolynom, it, _it);
	MPT_STRUCT(buffer) *buf;
	d->pos = 0;
	if ((buf = d->grid._buf)) {
		return buf->_used / sizeof(double);
	}
	return 0;
}